

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O3

bool __thiscall
Lib::Set<Kernel::OperatorType*,Kernel::OperatorType::TypeHash>::find<Kernel::OperatorType*>
          (Set<Kernel::OperatorType*,Kernel::OperatorType::TypeHash> *this,OperatorType *key,
          OperatorType **result)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  
  uVar2 = Kernel::OperatorType::TypeHash::hash(key);
  uVar3 = 2;
  if (2 < uVar2) {
    uVar3 = uVar2;
  }
  puVar4 = *(uint **)(this + 0x10);
  uVar2 = puVar4[((ulong)uVar3 % (ulong)*(uint *)this) * 4];
  if (uVar2 != 0) {
    puVar5 = puVar4 + ((ulong)uVar3 % (ulong)*(uint *)this) * 4;
    do {
      if (uVar2 == uVar3) {
        bVar1 = Kernel::OperatorType::TypeHash::equals(*(OperatorType **)(puVar5 + 2),key);
        if (bVar1) {
          *result = *(OperatorType **)(puVar5 + 2);
          return true;
        }
        puVar4 = *(uint **)(this + 0x10);
      }
      puVar5 = puVar5 + 4;
      if (puVar5 == *(uint **)(this + 0x18)) {
        puVar5 = puVar4;
      }
      uVar2 = *puVar5;
    } while (uVar2 != 0);
  }
  return false;
}

Assistant:

bool find(Key key, Val& result) const
  {
    unsigned code = Hash::hash(key);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,key)) {
	result=cell->value;
	return true;
      }
    }
    return false;
  }